

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_progress_bar_display.cpp
# Opt level: O2

void __thiscall
duckdb::TerminalProgressBarDisplay::PrintProgressInternal
          (TerminalProgressBarDisplay *this,int32_t percentage)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  double dVar4;
  string result;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::assign((char *)&result);
  if ((percentage < 100) && (::std::__cxx11::string::append((char *)&result), percentage < 10)) {
    ::std::__cxx11::string::append((char *)&result);
  }
  ::std::__cxx11::to_string(&local_68,percentage);
  ::std::operator+(&local_48,&local_68,"%");
  ::std::__cxx11::string::append((string *)&result);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::append((char *)&result);
  ::std::__cxx11::string::append((char *)&result);
  dVar4 = ((double)percentage / 100.0) * 60.0;
  uVar1 = (ulong)dVar4;
  uVar1 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  uVar2 = uVar1;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    ::std::__cxx11::string::append((char *)&result);
  }
  if (uVar1 < 0x3c) {
    ::std::__cxx11::string::append((char *)&result);
    uVar1 = uVar1 + 1;
  }
  for (; uVar1 < 0x3c; uVar1 = uVar1 + 1) {
    ::std::__cxx11::string::append((char *)&result);
  }
  ::std::__cxx11::string::append((char *)&result);
  ::std::__cxx11::string::append((char *)&result);
  Printer::RawPrint(STREAM_STDOUT,(string *)&result);
  ::std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void TerminalProgressBarDisplay::PrintProgressInternal(int32_t percentage) {
	string result;
	// we divide the number of blocks by the percentage
	// 0%   = 0
	// 100% = PROGRESS_BAR_WIDTH
	// the percentage determines how many blocks we need to draw
	double blocks_to_draw = PROGRESS_BAR_WIDTH * (percentage / 100.0);
	// because of the power of unicode, we can also draw partial blocks

	// render the percentage with some padding to ensure everything stays nicely aligned
	result = "\r";
	if (percentage < 100) {
		result += " ";
	}
	if (percentage < 10) {
		result += " ";
	}
	result += to_string(percentage) + "%";
	result += " ";
	result += PROGRESS_START;
	idx_t i;
	for (i = 0; i < idx_t(blocks_to_draw); i++) {
		result += PROGRESS_BLOCK;
	}
	if (i < PROGRESS_BAR_WIDTH) {
		// print a partial block based on the percentage of the progress bar remaining
		idx_t index = idx_t((blocks_to_draw - static_cast<double>(idx_t(blocks_to_draw))) * PARTIAL_BLOCK_COUNT);
		if (index >= PARTIAL_BLOCK_COUNT) {
			index = PARTIAL_BLOCK_COUNT - 1;
		}
		result += PROGRESS_PARTIAL[index];
		i++;
	}
	for (; i < PROGRESS_BAR_WIDTH; i++) {
		result += PROGRESS_EMPTY;
	}
	result += PROGRESS_END;
	result += " ";

	Printer::RawPrint(OutputStream::STREAM_STDOUT, result);
}